

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<tcu::Vector<float,_2>_> __thiscall
deqp::gls::BuiltinPrecisionTests::
createApply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,2>,float,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (BuiltinPrecisionTests *this,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func,ExprP<float> *arg0,ExprP<float> *arg1,
          ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg2,
          ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  Expr<tcu::Vector<float,_2>_> *ptr;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  
  ptr = (Expr<tcu::Vector<float,_2>_> *)operator_new(0x50);
  (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__Apply_02173600;
  ptr[1].super_ExprBase._vptr_ExprBase = (_func_int **)func;
  Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Tuple4((Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
            *)(ptr + 2),arg0,arg1,arg2,arg3);
  EVar1 = exprP<tcu::Vector<float,2>>(this,ptr);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}